

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void __thiscall Fl_Window::resize(Fl_Window *this,int X,int Y,int W,int H)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Fl_X *this_00;
  Window WVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  Fl_Window *pFVar9;
  
  pFVar9 = resize_bug_fix;
  bVar5 = (this->super_Fl_Group).super_Fl_Widget.y_ == Y;
  bVar6 = (this->super_Fl_Group).super_Fl_Widget.x_ == X;
  bVar7 = (this->super_Fl_Group).super_Fl_Widget.h_ == H;
  bVar8 = (this->super_Fl_Group).super_Fl_Widget.w_ == W;
  if (resize_bug_fix == this) {
    resize_bug_fix = (Fl_Window *)0x0;
  }
  if (bVar5 && bVar6 || pFVar9 == this) {
    if ((bVar5 && bVar6) && (bVar7 && bVar8)) {
      return;
    }
  }
  else {
    puVar1 = &(this->super_Fl_Group).super_Fl_Widget.flags_;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
  }
  if (bVar7 && bVar8) {
    (this->super_Fl_Group).super_Fl_Widget.x_ = X;
    (this->super_Fl_Group).super_Fl_Widget.y_ = Y;
  }
  else {
    Fl_Group::resize(&this->super_Fl_Group,X,Y,W,H);
    if (this->i != (Fl_X *)0x0) {
      Fl_Widget::redraw((Fl_Widget *)this);
    }
  }
  if (((!bVar7 || !bVar8) && pFVar9 != this) &&
     ((this->super_Fl_Group).resizable_ == (Fl_Widget *)0x0)) {
    iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
    iVar3 = (this->super_Fl_Group).super_Fl_Widget.h_;
    this->minw = iVar2;
    this->minh = iVar3;
    this->maxw = iVar2;
    this->maxh = iVar3;
    this->dw = 0;
    this->dh = 0;
    this->aspect = 0;
    this->size_range_set = '\x01';
    if (this->i != (Fl_X *)0x0) {
      Fl_X::sendxjunk(this->i);
    }
  }
  if ((pFVar9 == this) || (this_00 = this->i, this_00 == (Fl_X *)0x0)) {
    return;
  }
  if (bVar7 && bVar8) {
    XMoveWindow(fl_display,this_00->xid,X,Y);
    return;
  }
  if ((this->super_Fl_Group).resizable_ == (Fl_Widget *)0x0) {
    iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
    iVar3 = (this->super_Fl_Group).super_Fl_Widget.h_;
    this->minw = iVar2;
    this->minh = iVar3;
    this->maxw = iVar2;
    this->maxh = iVar3;
    this->dw = 0;
    this->dh = 0;
    this->aspect = 0;
    this->size_range_set = '\x01';
    Fl_X::sendxjunk(this_00);
  }
  WVar4 = this->i->xid;
  if (W < 2) {
    W = 1;
  }
  iVar2 = 1;
  if (1 < H) {
    iVar2 = H;
  }
  if (bVar5 && bVar6) {
    XResizeWindow(fl_display,WVar4,W,iVar2);
    return;
  }
  XMoveResizeWindow(fl_display,WVar4,X,Y,W);
  return;
}

Assistant:

void Fl_Window::resize(int X,int Y,int W,int H) {
  int is_a_move = (X != x() || Y != y());
  int is_a_resize = (W != w() || H != h());
  int resize_from_program = (this != resize_bug_fix);
  if (!resize_from_program) resize_bug_fix = 0;
  if (is_a_move && resize_from_program) set_flag(FORCE_POSITION);
  else if (!is_a_resize && !is_a_move) return;
  if (is_a_resize) {
    Fl_Group::resize(X,Y,W,H);
    if (shown()) {redraw();}
  } else {
    x(X); y(Y);
  }

  if (resize_from_program && is_a_resize && !resizable()) {
    size_range(w(), h(), w(), h());
  }

  if (resize_from_program && shown()) {
    if (is_a_resize) {
      if (!resizable()) size_range(w(),h(),w(),h());
      if (is_a_move) {
        XMoveResizeWindow(fl_display, i->xid, X, Y, W>0 ? W : 1, H>0 ? H : 1);
      } else {
        XResizeWindow(fl_display, i->xid, W>0 ? W : 1, H>0 ? H : 1);
      }
    } else
      XMoveWindow(fl_display, i->xid, X, Y);
  }
}